

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

void Omega_h::update_class_sets(ClassSets *p_sets,InputMap *pl)

{
  bool bVar1;
  LO LVar2;
  undefined8 uVar3;
  mapped_type *this;
  ClassPair local_68;
  LO local_60;
  int local_5c;
  LO class_id;
  Int class_dim;
  InputList *pair;
  LO i;
  LO npairs;
  InputList *pairs;
  string *set_name;
  InputMapIterator __end1;
  InputMapIterator __begin1;
  InputMap *__range1;
  ClassSets *sets;
  InputMap *pl_local;
  ClassSets *p_sets_local;
  
  __end1 = InputMap::begin(pl);
  set_name = (string *)InputMap::end(pl);
  do {
    bVar1 = InputMapIterator::operator!=(&__end1,(InputMapIterator *)&set_name);
    if (!bVar1) {
      return;
    }
    pairs = (InputList *)InputMapIterator::operator*[abi_cxx11_(&__end1);
    _i = InputMap::get_list(pl,(string *)pairs);
    pair._4_4_ = InputList::size(_i);
    for (pair._0_4_ = 0; (int)pair < pair._4_4_; pair._0_4_ = (int)pair + 1) {
      _class_id = InputList::get_list(_i,(int)pair);
      LVar2 = InputList::size(_class_id);
      if (LVar2 != 2) {
        uVar3 = std::__cxx11::string::c_str();
        fail("Expected \"%s\" to be an array of int pairs\n",uVar3);
      }
      local_5c = InputList::get<int>(_class_id,0);
      local_60 = InputList::get<int>(_class_id,1);
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](p_sets,(key_type *)pairs);
      ClassPair::ClassPair(&local_68,local_5c,local_60);
      std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::push_back
                (this,&local_68);
    }
    InputMapIterator::operator++(&__end1);
  } while( true );
}

Assistant:

void update_class_sets(ClassSets* p_sets, InputMap& pl) {
  ClassSets& sets = *p_sets;
  for (auto& set_name : pl) {
    auto& pairs = pl.get_list(set_name);
    auto npairs = pairs.size();
    for (decltype(npairs) i = 0; i < npairs; ++i) {
      auto& pair = pairs.get_list(i);
      if (pair.size() != 2) {
        Omega_h_fail(
            "Expected \"%s\" to be an array of int pairs\n", set_name.c_str());
      }
      auto class_dim = Int(pair.get<int>(0));
      auto class_id = LO(pair.get<int>(1));
      sets[set_name].push_back({class_dim, class_id});
    }
  }
}